

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricDecoderGetDecodableMetricsExp
          (zet_metric_decoder_exp_handle_t hMetricDecoder,uint32_t *pCount,
          zet_metric_handle_t *phMetrics)

{
  zet_metric_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  zet_pfnMetricDecoderGetDecodableMetricsExp_t pfnGetDecodableMetricsExp;
  ze_result_t result;
  zet_metric_handle_t *phMetrics_local;
  uint32_t *pCount_local;
  zet_metric_decoder_exp_handle_t hMetricDecoder_local;
  
  pfnGetDecodableMetricsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c7f0 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phMetrics != (zet_metric_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (zet_metric_handle_t)context_t::get((context_t *)&context);
      phMetrics[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnGetDecodableMetricsExp._4_4_ = (*DAT_0011c7f0)(hMetricDecoder,pCount,phMetrics);
  }
  return pfnGetDecodableMetricsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDecoderGetDecodableMetricsExp(
        zet_metric_decoder_exp_handle_t hMetricDecoder, ///< [in] handle of the metric decoder object
        uint32_t* pCount,                               ///< [in,out] pointer to number of decodable metric in the hMetricDecoder
                                                        ///< handle. If count is zero, then the driver shall 
                                                        ///< update the value with the total number of decodable metrics available
                                                        ///< in the decoder. if count is greater than zero 
                                                        ///< but less than the total number of decodable metrics available in the
                                                        ///< decoder, then only that number will be returned. 
                                                        ///< if count is greater than the number of decodable metrics available in
                                                        ///< the decoder, then the driver shall update the 
                                                        ///< value with the actual number of decodable metrics available. 
        zet_metric_handle_t* phMetrics                  ///< [in,out] [range(0, *pCount)] array of handles of decodable metrics in
                                                        ///< the hMetricDecoder handle provided.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDecodableMetricsExp = context.zetDdiTable.MetricDecoderExp.pfnGetDecodableMetricsExp;
        if( nullptr != pfnGetDecodableMetricsExp )
        {
            result = pfnGetDecodableMetricsExp( hMetricDecoder, pCount, phMetrics );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phMetrics ) && ( i < *pCount ); ++i )
                phMetrics[ i ] = reinterpret_cast<zet_metric_handle_t>( context.get() );

        }

        return result;
    }